

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::_preBegin__profile_GLES__technique__pass__color_mask
          (ColladaParserAutoGen14Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *additionalText;
  undefined8 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  byte *pbVar6;
  StringHash SVar7;
  char cVar8;
  xmlChar **ppxVar9;
  
  pbVar6 = (byte *)GeneratedSaxParser::StackMemoryManager::newObject
                             (&(this->
                               super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                               ).super_ParserTemplateBase.mStackMemoryManager,0x20);
  uVar1 = profile_GLES__technique__pass__color_mask__AttributeData::DEFAULT._8_8_;
  *(undefined8 *)pbVar6 = profile_GLES__technique__pass__color_mask__AttributeData::DEFAULT._0_8_;
  *(undefined8 *)(pbVar6 + 8) = uVar1;
  uVar4 = profile_GLES__technique__pass__color_mask__AttributeData::DEFAULT._28_4_;
  uVar3 = profile_GLES__technique__pass__color_mask__AttributeData::DEFAULT._24_4_;
  uVar2 = profile_GLES__technique__pass__color_mask__AttributeData::DEFAULT._20_4_;
  *(undefined4 *)(pbVar6 + 0x10) =
       profile_GLES__technique__pass__color_mask__AttributeData::DEFAULT._16_4_;
  *(undefined4 *)(pbVar6 + 0x14) = uVar2;
  *(undefined4 *)(pbVar6 + 0x18) = uVar3;
  *(undefined4 *)(pbVar6 + 0x1c) = uVar4;
  *attributeDataPtr = pbVar6;
  ppxVar9 = attributes->attributes;
  if (ppxVar9 != (xmlChar **)0x0) {
    do {
      text = *ppxVar9;
      if (text == (ParserChar *)0x0) {
        cVar8 = '\x03';
        goto LAB_006b5eb5;
      }
      SVar7 = GeneratedSaxParser::Utils::calculateStringHash(text);
      additionalText = ppxVar9[1];
      ppxVar9 = ppxVar9 + 2;
      if (SVar7 == 0x76887d) {
        *(ParserChar **)(pbVar6 + 0x18) = additionalText;
LAB_006b5eb3:
        cVar8 = '\0';
      }
      else if (SVar7 == 0x7c83b5) {
        bVar5 = GeneratedSaxParser::
                ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                ::characterData2List<bool,_&GeneratedSaxParser::Utils::toBool>
                          (&this->
                            super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                           ,additionalText,(XSList<bool> *)(pbVar6 + 8));
        if (bVar5) {
          *pbVar6 = *pbVar6 | 1;
          cVar8 = '\x04';
          bVar5 = true;
        }
        else {
          bVar5 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_ATTRIBUTE_PARSING_FAILED,0x6849eab,0x7c83b5,additionalText);
          bVar5 = !bVar5;
          cVar8 = bVar5 * '\x03' + '\x01';
        }
        if (bVar5) goto LAB_006b5eb3;
      }
      else {
        bVar5 = GeneratedSaxParser::ParserTemplateBase::handleError
                          ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                           ERROR_UNKNOWN_ATTRIBUTE,0x6849eab,text,additionalText);
        cVar8 = '\x01';
        if (!bVar5) goto LAB_006b5eb3;
      }
LAB_006b5eb5:
    } while (cVar8 == '\0');
    if (cVar8 != '\x03') {
      return false;
    }
  }
  if ((*pbVar6 & 1) == 0) {
    pbVar6[8] = 0;
    pbVar6[9] = 0;
    pbVar6[10] = 0;
    pbVar6[0xb] = 0;
    pbVar6[0xc] = 0;
    pbVar6[0xd] = 0;
    pbVar6[0xe] = 0;
    pbVar6[0xf] = 0;
    pbVar6[0x10] = 0;
    pbVar6[0x11] = 0;
    pbVar6[0x12] = 0;
    pbVar6[0x13] = 0;
    pbVar6[0x14] = 0;
    pbVar6[0x15] = 0;
    pbVar6[0x16] = 0;
    pbVar6[0x17] = 0;
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen14Private::_preBegin__profile_GLES__technique__pass__color_mask( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__profile_GLES__technique__pass__color_mask( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

profile_GLES__technique__pass__color_mask__AttributeData* attributeData = newData<profile_GLES__technique__pass__color_mask__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_value:
    {
bool failed;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
failed = !characterData2BoolList(attributeValue, attributeData->value, 0, HASH_ELEMENT_COLOR_MASK, HASH_ATTRIBUTE_value);
    }
    else
    {
failed = !characterData2BoolList(attributeValue, attributeData->value);
    }
#else
    {
failed = !characterData2BoolList(attributeValue, attributeData->value);
    } // validation
#endif
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_COLOR_MASK,
        HASH_ATTRIBUTE_value,
        attributeValue))
{
    return false;
}
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__bool4(attributeData->value.data, attributeData->value.size);
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_COLOR_MASK,
            HASH_ATTRIBUTE_value,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

if ( !failed )
    attributeData->present_attributes |= profile_GLES__technique__pass__color_mask__AttributeData::ATTRIBUTE_VALUE_PRESENT;

    break;
    }
    case HASH_ATTRIBUTE_param:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_COLOR_MASK,
            HASH_ATTRIBUTE_param,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_COLOR_MASK, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ((attributeData->present_attributes & profile_GLES__technique__pass__color_mask__AttributeData::ATTRIBUTE_VALUE_PRESENT) == 0)
{
    attributeData->value = GeneratedSaxParser::XSList<bool>();
}


    return true;
}